

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Detail::Approx::setEpsilon(Approx *this,double newEpsilon)

{
  ReusableStringStream *pRVar1;
  string *in_RDI;
  double in_XMM0_Qa;
  char (*in_stack_ffffffffffffff78) [37];
  ReusableStringStream *in_stack_ffffffffffffff80;
  ReusableStringStream *in_stack_ffffffffffffffb0;
  
  if ((0.0 <= in_XMM0_Qa) && (in_XMM0_Qa <= 1.0)) {
    *(double *)in_RDI = in_XMM0_Qa;
    return;
  }
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffb0);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff80,(char (*) [26])in_stack_ffffffffffffff78);
  ReusableStringStream::operator<<(in_stack_ffffffffffffff80,(double *)in_stack_ffffffffffffff78);
  pRVar1 = ReusableStringStream::operator<<(in_stack_ffffffffffffff80,*in_stack_ffffffffffffff78);
  pRVar1 = ReusableStringStream::operator<<(pRVar1,in_stack_ffffffffffffff78);
  ReusableStringStream::str_abi_cxx11_(pRVar1);
  throw_domain_error(in_RDI);
}

Assistant:

void Approx::setEpsilon(double newEpsilon) {
        CATCH_ENFORCE(newEpsilon >= 0 && newEpsilon <= 1.0,
            "Invalid Approx::epsilon: " << newEpsilon << '.'
            << " Approx::epsilon has to be in [0, 1]");
        m_epsilon = newEpsilon;
    }